

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
base64_decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
             string *encoded_string)

{
  pointer *ppuVar1;
  iterator iVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  byte local_49 [4];
  byte local_45 [4];
  byte local_41;
  long local_40;
  string *local_38;
  
  local_38 = encoded_string;
  sVar7 = encoded_string->_M_string_length;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (sVar7 == 0) {
    local_40 = 0;
  }
  else {
    lVar5 = 0;
    local_40 = 0;
    do {
      bVar3 = (local_38->_M_dataplus)._M_p[lVar5];
      if ((bVar3 == 0x3d) ||
         ((iVar4 = isalnum((uint)bVar3), (bVar3 & 0xfb) != 0x2b && (iVar4 == 0)))) break;
      local_49[local_40] = bVar3;
      local_40 = local_40 + 1;
      if (local_40 == 4) {
        lVar6 = 0;
        do {
          bVar3 = std::__cxx11::string::find(-0x60,(ulong)(uint)(int)(char)local_49[lVar6]);
          local_49[lVar6] = bVar3;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        local_45[0] = local_49[1] >> 4 & 3 | local_49[0] << 2;
        local_45[1] = local_49[2] >> 2 & 0xf | local_49[1] << 4;
        local_45[2] = local_49[2] * '@' + local_49[3];
        lVar6 = 0;
        do {
          local_41 = local_45[lVar6];
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>(__return_storage_ptr__,iVar2,&local_41);
          }
          else {
            *iVar2._M_current = local_45[lVar6];
            ppuVar1 = &(__return_storage_ptr__->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_40 = 0;
      }
      sVar7 = sVar7 - 1;
      lVar5 = lVar5 + 1;
    } while (sVar7 != 0);
  }
  lVar5 = local_40;
  if (local_40 != 0) {
    lVar6 = 0;
    do {
      bVar3 = std::__cxx11::string::find(-0x60,(ulong)(uint)(int)(char)local_49[lVar6]);
      local_49[lVar6] = bVar3;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
    local_45[0] = local_49[1] >> 4 & 3 | local_49[0] << 2;
    local_45[1] = local_49[2] >> 2 & 0xf | local_49[1] << 4;
    if (lVar5 != 1) {
      lVar6 = 0;
      do {
        local_45[3] = local_45[lVar6];
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>(__return_storage_ptr__,iVar2,local_45 + 3);
        }
        else {
          *iVar2._M_current = local_45[lVar6];
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar5 + -1 != lVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> base64_decode(const std::string& encoded_string)
	{
		std::size_t in_len = encoded_string.size();
		std::size_t i = 0;
		std::size_t j = 0;
		std::size_t in_ = 0;
		unsigned char char_array_4[4], char_array_3[3];
		std::vector<uint8_t> ret;

		while (in_len-- && (encoded_string[in_] != '=') && is_base64(encoded_string[in_])) {
			char_array_4[i++] = encoded_string[in_]; in_++;
			if (i == 4) {
				for (i = 0; i < 4; i++)
					char_array_4[i] = (unsigned char)base64_chars.find(char_array_4[i]);

				char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
				char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
				char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

				for (i = 0; (i < 3); i++)
					ret.push_back((uint8_t)char_array_3[i]);
				i = 0;
			}
		}
		if (i) {
			for (j = 0; j < i; j++)
				char_array_4[j] = (unsigned char)base64_chars.find(char_array_4[j]);

			char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
			char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);

			for (j = 0; (j < i - 1); j++) ret.push_back((uint8_t)char_array_3[j]);
		}
		return ret;
	}